

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_threads_purge(mk_sched_worker *sched)

{
  int iVar1;
  int c;
  mk_sched_worker *sched_local;
  
  iVar1 = sched_thread_cleanup(sched,&sched->threads_purge);
  return iVar1;
}

Assistant:

int mk_sched_threads_purge(struct mk_sched_worker *sched)
{
    int c = 0;

    c = sched_thread_cleanup(sched, &sched->threads_purge);
    return c;
}